

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  uint uVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  ulong uVar4;
  StackInst *pSVar5;
  ulong uVar6;
  pointer ppSVar7;
  uint uVar8;
  bool bVar9;
  
  uVar8 = 0;
  bVar9 = false;
  while( true ) {
    ppSVar2 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar3 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppSVar3 - (long)ppSVar2 >> 3) <= (ulong)uVar8) break;
    pSVar5 = ppSVar2[uVar8];
    if (pSVar5 != (StackInst *)0x0) {
      if (bVar9) {
        uVar1 = pSVar5->op - BlockEnd;
        if ((uVar1 < 0xd) && ((0x17adU >> (uVar1 & 0x1f) & 1) != 0)) {
          bVar9 = false;
        }
        else {
          removeAt(this,uVar8);
          bVar9 = true;
        }
      }
      else {
        bVar9 = (pSVar5->type).id == 1;
      }
    }
    uVar8 = uVar8 + 1;
  }
  uVar4 = 1;
  uVar8 = 0;
  do {
    if ((ulong)((long)ppSVar3 - (long)ppSVar2 >> 3) <= uVar4) {
      return;
    }
    pSVar5 = ppSVar2[uVar4];
    if (((pSVar5 != (StackInst *)0x0) && (pSVar5->op == Basic)) &&
       (uVar1 = uVar8, pSVar5->origin->_id == UnreachableId)) {
      do {
        uVar6 = (ulong)uVar1;
        if (uVar1 == 0) {
          pSVar5 = *ppSVar2;
          ppSVar7 = ppSVar2;
          if (pSVar5 == (StackInst *)0x0) goto LAB_00cf7e82;
          goto LAB_00cf7e65;
        }
        pSVar5 = ppSVar2[uVar1];
        uVar1 = uVar1 - 1;
      } while (pSVar5 == (StackInst *)0x0);
      ppSVar7 = ppSVar2 + uVar6;
LAB_00cf7e65:
      if ((pSVar5->op == Basic) && (pSVar5->origin->_id == DropId)) {
        *ppSVar7 = (StackInst *)0x0;
        ppSVar2 = (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        ppSVar3 = (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
      }
    }
LAB_00cf7e82:
    uVar4 = (ulong)((int)uVar4 + 1);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void StackIROptimizer::dce() {
  // Remove code after an unreachable instruction: anything after it, up to the
  // next control flow barrier, can simply be removed.
  bool inUnreachableCode = false;
  for (Index i = 0; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (inUnreachableCode) {
      // Does the unreachable code end here?
      if (isControlFlowBarrier(inst)) {
        inUnreachableCode = false;
      } else {
        // We can remove this.
        removeAt(i);
      }
    } else if (inst->type == Type::unreachable) {
      inUnreachableCode = true;
    }
  }

  // Remove code before an Unreachable. Consider this:
  //
  //  (drop
  //   ..
  //  )
  //  (unreachable)
  //
  // The drop is not needed, as the unreachable puts the stack in the
  // polymorphic state anyhow. Note that we don't need to optimize anything
  // other than a drop here, as in general the Binaryen IR DCE pass will handle
  // everything else. A drop followed by an unreachable is the only thing that
  // pass cannot handle, as the structured form of Binaryen IR does not allow
  // removing such a drop, and so we can only do it here in StackIR.
  //
  // TODO: We can look even further back, say if there is another drop of
  //       something before, then we can remove that drop as well. To do that
  //       we'd need to inspect the stack going backwards.
  for (Index i = 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst || inst->op != StackInst::Basic ||
        !inst->origin->is<Unreachable>()) {
      continue;
    }

    // Look back past nulls.
    Index j = i - 1;
    while (j > 0 && !insts[j]) {
      j--;
    }

    auto*& prev = insts[j];
    if (prev && prev->op == StackInst::Basic && prev->origin->is<Drop>()) {
      prev = nullptr;
    }
  }
}